

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void setLedState(GPIOClass *pledPin,string *new_state)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)new_state);
  GPIOClass::setval_gpio(pledPin,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void setLedState(GPIOClass* pledPin, const string new_state)
{
    pledPin->setval_gpio(new_state);
}